

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

HTS_Boolean
HTS_PStreamSet_create
          (HTS_PStreamSet *pss,HTS_SStreamSet *sss,double *msd_threshold,double *gv_weight)

{
  double *pdVar1;
  bool bVar2;
  HTS_Boolean HVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  ulong *puVar7;
  double **ppdVar8;
  HTS_PStream *pHVar9;
  long in_RCX;
  long in_RDX;
  HTS_SStreamSet *in_RSI;
  long *in_RDI;
  double dVar10;
  HTS_Boolean not_bound;
  HTS_PStream *pst;
  size_t state;
  size_t msd_frame;
  size_t frame;
  int shift;
  size_t m;
  size_t l;
  size_t k;
  size_t j;
  size_t i;
  HTS_PStream *in_stack_ffffffffffffff20;
  ulong in_stack_ffffffffffffff28;
  ulong local_70;
  long local_68;
  long local_60;
  int local_54;
  ulong local_48;
  ulong local_40;
  HTS_PStream *local_38;
  ulong local_30;
  HTS_Boolean local_1;
  
  if (in_RDI[1] == 0) {
    sVar5 = HTS_SStreamSet_get_nstream(in_RSI);
    in_RDI[1] = sVar5;
    pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
    *in_RDI = (long)pvVar6;
    sVar5 = HTS_SStreamSet_get_total_frame(in_RSI);
    in_RDI[2] = sVar5;
    for (local_30 = 0; local_30 < (ulong)in_RDI[1]; local_30 = local_30 + 1) {
      puVar7 = (ulong *)(*in_RDI + local_30 * 0x90);
      HVar3 = HTS_SStreamSet_is_msd(in_RSI,local_30);
      if (HVar3 == '\x01') {
        puVar7[1] = 0;
        for (local_70 = 0; sVar5 = HTS_SStreamSet_get_total_state(in_RSI), local_70 < sVar5;
            local_70 = local_70 + 1) {
          dVar10 = HTS_SStreamSet_get_msd(in_RSI,local_30,local_70);
          pdVar1 = (double *)(in_RDX + local_30 * 8);
          if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
            sVar5 = HTS_SStreamSet_get_duration(in_RSI,local_70);
            puVar7[1] = sVar5 + puVar7[1];
          }
        }
        pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[0xd] = (ulong)pvVar6;
        local_60 = 0;
        for (local_70 = 0; sVar5 = HTS_SStreamSet_get_total_state(in_RSI), local_70 < sVar5;
            local_70 = local_70 + 1) {
          dVar10 = HTS_SStreamSet_get_msd(in_RSI,local_30,local_70);
          pdVar1 = (double *)(in_RDX + local_30 * 8);
          if (dVar10 < *pdVar1 || dVar10 == *pdVar1) {
            for (local_38 = (HTS_PStream *)0x0; sVar5 = HTS_SStreamSet_get_duration(in_RSI,local_70)
                , local_38 < sVar5; local_38 = (HTS_PStream *)((long)local_38 + 1)) {
              *(undefined1 *)(puVar7[0xd] + local_60) = 0;
              local_60 = local_60 + 1;
            }
          }
          else {
            for (local_38 = (HTS_PStream *)0x0; sVar5 = HTS_SStreamSet_get_duration(in_RSI,local_70)
                , local_38 < sVar5; local_38 = (HTS_PStream *)((long)local_38 + 1)) {
              *(undefined1 *)(puVar7[0xd] + local_60) = 1;
              local_60 = local_60 + 1;
            }
          }
        }
      }
      else {
        puVar7[1] = in_RDI[2];
        puVar7[0xd] = 0;
      }
      sVar5 = HTS_SStreamSet_get_vector_length(in_RSI,local_30);
      *puVar7 = sVar5;
      sVar5 = HTS_SStreamSet_get_window_max_width(in_RSI,local_30);
      puVar7[2] = sVar5 * 2 + 1;
      sVar5 = HTS_SStreamSet_get_window_size(in_RSI,local_30);
      puVar7[9] = sVar5;
      if (puVar7[1] != 0) {
        ppdVar8 = HTS_alloc_matrix(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[4] = (ulong)ppdVar8;
        ppdVar8 = HTS_alloc_matrix(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[5] = (ulong)ppdVar8;
        pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[8] = (ulong)pvVar6;
        ppdVar8 = HTS_alloc_matrix(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[7] = (ulong)ppdVar8;
        pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[6] = (ulong)pvVar6;
        ppdVar8 = HTS_alloc_matrix(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[3] = (ulong)ppdVar8;
      }
      pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
      puVar7[10] = (ulong)pvVar6;
      pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
      puVar7[0xb] = (ulong)pvVar6;
      pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
      puVar7[0xc] = (ulong)pvVar6;
      for (local_38 = (HTS_PStream *)0x0; local_38 < puVar7[9];
          local_38 = (HTS_PStream *)((long)local_38 + 1)) {
        iVar4 = HTS_SStreamSet_get_window_left_width(in_RSI,local_30,(size_t)local_38);
        *(int *)(puVar7[10] + (long)local_38 * 4) = iVar4;
        iVar4 = HTS_SStreamSet_get_window_right_width(in_RSI,local_30,(size_t)local_38);
        *(int *)(puVar7[0xb] + (long)local_38 * 4) = iVar4;
        if (*(int *)(puVar7[10] + (long)local_38 * 4) + *(int *)(puVar7[0xb] + (long)local_38 * 4)
            == 0) {
          pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
          *(void **)(puVar7[0xc] + (long)local_38 * 8) = pvVar6;
        }
        else {
          pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
          *(void **)(puVar7[0xc] + (long)local_38 * 8) = pvVar6;
        }
        *(long *)(puVar7[0xc] + (long)local_38 * 8) =
             *(long *)(puVar7[0xc] + (long)local_38 * 8) +
             (long)*(int *)(puVar7[10] + (long)local_38 * 4) * -8;
        for (local_54 = *(int *)(puVar7[10] + (long)local_38 * 4);
            local_54 <= *(int *)(puVar7[0xb] + (long)local_38 * 4); local_54 = local_54 + 1) {
          dVar10 = HTS_SStreamSet_get_window_coefficient(in_RSI,local_30,(size_t)local_38,local_54);
          *(double *)(*(long *)(puVar7[0xc] + (long)local_38 * 8) + (long)local_54 * 8) = dVar10;
        }
      }
      HVar3 = HTS_SStreamSet_use_gv(in_RSI,local_30);
      if (HVar3 == '\0') {
        puVar7[0x10] = 0;
        puVar7[0x11] = 0;
        puVar7[0xe] = 0;
        puVar7[0xf] = 0;
      }
      else {
        pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[0xe] = (ulong)pvVar6;
        pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[0xf] = (ulong)pvVar6;
        for (local_38 = (HTS_PStream *)0x0; local_38 < *puVar7;
            local_38 = (HTS_PStream *)((long)local_38 + 1)) {
          dVar10 = HTS_SStreamSet_get_gv_mean(in_RSI,local_30,(size_t)local_38);
          *(double *)(puVar7[0xe] + (long)local_38 * 8) =
               dVar10 * *(double *)(in_RCX + local_30 * 8);
          dVar10 = HTS_SStreamSet_get_gv_vari(in_RSI,local_30,(size_t)local_38);
          *(double *)(puVar7[0xf] + (long)local_38 * 8) = dVar10;
        }
        pvVar6 = HTS_calloc(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
        puVar7[0x10] = (ulong)pvVar6;
        HVar3 = HTS_SStreamSet_is_msd(in_RSI,local_30);
        if (HVar3 == '\x01') {
          local_60 = 0;
          local_68 = 0;
          for (local_70 = 0; sVar5 = HTS_SStreamSet_get_total_state(in_RSI), local_70 < sVar5;
              local_70 = local_70 + 1) {
            for (local_38 = (HTS_PStream *)0x0; sVar5 = HTS_SStreamSet_get_duration(in_RSI,local_70)
                , local_38 < sVar5; local_38 = (HTS_PStream *)((long)local_38 + 1)) {
              if (*(char *)(puVar7[0xd] + local_60) == '\x01') {
                HVar3 = HTS_SStreamSet_get_gv_switch(in_RSI,local_30,local_70);
                *(HTS_Boolean *)(puVar7[0x10] + local_68) = HVar3;
                local_68 = local_68 + 1;
              }
              local_60 = local_60 + 1;
            }
          }
        }
        else {
          local_60 = 0;
          for (local_70 = 0; sVar5 = HTS_SStreamSet_get_total_state(in_RSI), local_70 < sVar5;
              local_70 = local_70 + 1) {
            for (local_38 = (HTS_PStream *)0x0; sVar5 = HTS_SStreamSet_get_duration(in_RSI,local_70)
                , local_38 < sVar5; local_38 = (HTS_PStream *)((long)local_38 + 1)) {
              HVar3 = HTS_SStreamSet_get_gv_switch(in_RSI,local_30,local_70);
              *(HTS_Boolean *)(puVar7[0x10] + local_60) = HVar3;
              local_60 = local_60 + 1;
            }
          }
        }
        local_38 = (HTS_PStream *)0x0;
        puVar7[0x11] = 0;
        for (; local_38 < puVar7[1]; local_38 = (HTS_PStream *)((long)local_38 + 1)) {
          if (*(char *)(puVar7[0x10] + (long)local_38) != '\0') {
            puVar7[0x11] = puVar7[0x11] + 1;
          }
        }
      }
      HVar3 = HTS_SStreamSet_is_msd(in_RSI,local_30);
      if (HVar3 == '\x01') {
        local_60 = 0;
        local_68 = 0;
        for (local_70 = 0; sVar5 = HTS_SStreamSet_get_total_state(in_RSI), local_70 < sVar5;
            local_70 = local_70 + 1) {
          for (local_38 = (HTS_PStream *)0x0; sVar5 = HTS_SStreamSet_get_duration(in_RSI,local_70),
              local_38 < sVar5; local_38 = (HTS_PStream *)((long)local_38 + 1)) {
            if (*(char *)(puVar7[0xd] + local_60) == '\x01') {
              for (local_40 = 0; local_40 < puVar7[9]; local_40 = local_40 + 1) {
                bVar2 = true;
                for (local_54 = *(int *)(puVar7[10] + local_40 * 4);
                    local_54 <= *(int *)(puVar7[0xb] + local_40 * 4); local_54 = local_54 + 1) {
                  if ((((int)local_60 + local_54 < 0) ||
                      ((int)in_RDI[2] <= (int)local_60 + local_54)) ||
                     (*(char *)(puVar7[0xd] + local_60 + local_54) != '\x01')) {
                    bVar2 = false;
                    break;
                  }
                }
                for (local_48 = 0; local_48 < *puVar7; local_48 = local_48 + 1) {
                  sVar5 = *puVar7 * local_40 + local_48;
                  dVar10 = HTS_SStreamSet_get_mean(in_RSI,local_30,local_70,sVar5);
                  *(double *)(*(long *)(puVar7[4] + local_68 * 8) + sVar5 * 8) = dVar10;
                  if ((bVar2) || (local_40 == 0)) {
                    dVar10 = HTS_SStreamSet_get_vari(in_RSI,local_30,local_70,sVar5);
                    dVar10 = HTS_finv(dVar10);
                    *(double *)(*(long *)(puVar7[5] + local_68 * 8) + sVar5 * 8) = dVar10;
                  }
                  else {
                    *(undefined8 *)(*(long *)(puVar7[5] + local_68 * 8) + sVar5 * 8) = 0;
                  }
                }
              }
              local_68 = local_68 + 1;
            }
            local_60 = local_60 + 1;
          }
        }
      }
      else {
        local_70 = 0;
        local_60 = 0;
        while (in_stack_ffffffffffffff28 = local_70, sVar5 = HTS_SStreamSet_get_total_state(in_RSI),
              in_stack_ffffffffffffff28 < sVar5) {
          local_38 = (HTS_PStream *)0x0;
          while (in_stack_ffffffffffffff20 = local_38,
                pHVar9 = (HTS_PStream *)HTS_SStreamSet_get_duration(in_RSI,local_70),
                in_stack_ffffffffffffff20 < pHVar9) {
            for (local_40 = 0; local_40 < puVar7[9]; local_40 = local_40 + 1) {
              bVar2 = true;
              for (local_54 = *(int *)(puVar7[10] + local_40 * 4);
                  local_54 <= *(int *)(puVar7[0xb] + local_40 * 4); local_54 = local_54 + 1) {
                if (((int)local_60 + local_54 < 0) || ((int)in_RDI[2] <= (int)local_60 + local_54))
                {
                  bVar2 = false;
                  break;
                }
              }
              for (local_48 = 0; local_48 < *puVar7; local_48 = local_48 + 1) {
                sVar5 = *puVar7 * local_40 + local_48;
                dVar10 = HTS_SStreamSet_get_mean(in_RSI,local_30,local_70,sVar5);
                *(double *)(*(long *)(puVar7[4] + local_60 * 8) + sVar5 * 8) = dVar10;
                if ((bVar2) || (local_40 == 0)) {
                  dVar10 = HTS_SStreamSet_get_vari(in_RSI,local_30,local_70,sVar5);
                  dVar10 = HTS_finv(dVar10);
                  *(double *)(*(long *)(puVar7[5] + local_60 * 8) + sVar5 * 8) = dVar10;
                }
                else {
                  *(undefined8 *)(*(long *)(puVar7[5] + local_60 * 8) + sVar5 * 8) = 0;
                }
              }
            }
            local_60 = local_60 + 1;
            local_38 = (HTS_PStream *)((long)&local_38->vector_length + 1);
          }
          local_70 = local_70 + 1;
        }
      }
      HTS_PStream_mlpg(in_stack_ffffffffffffff20);
    }
    local_1 = '\x01';
  }
  else {
    HTS_error(1,"HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

HTS_Boolean HTS_PStreamSet_create(HTS_PStreamSet * pss, HTS_SStreamSet * sss, double *msd_threshold, double *gv_weight)
{
   size_t i, j, k, l, m;
   int shift;
   size_t frame, msd_frame, state;

   HTS_PStream *pst;
   HTS_Boolean not_bound;

   if (pss->nstream != 0) {
      HTS_error(1, "HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
      return FALSE;
   }

   /* initialize */
   pss->nstream = HTS_SStreamSet_get_nstream(sss);
   pss->pstream = (HTS_PStream *) HTS_calloc(pss->nstream, sizeof(HTS_PStream));
   pss->total_frame = HTS_SStreamSet_get_total_frame(sss);

   /* create */
   for (i = 0; i < pss->nstream; i++) {
      pst = &pss->pstream[i];
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         pst->length = 0;
         for (state = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i])
               pst->length += HTS_SStreamSet_get_duration(sss, state);
         pst->msd_flag = (HTS_Boolean *) HTS_calloc(pss->total_frame, sizeof(HTS_Boolean));
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i]) {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = TRUE;
                  frame++;
               }
            } else {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = FALSE;
                  frame++;
               }
            }
         }
      } else {                  /* for non MSD */
         pst->length = pss->total_frame;
         pst->msd_flag = NULL;
      }
      pst->vector_length = HTS_SStreamSet_get_vector_length(sss, i);
      pst->width = HTS_SStreamSet_get_window_max_width(sss, i) * 2 + 1; /* band width of R */
      pst->win_size = HTS_SStreamSet_get_window_size(sss, i);
      if (pst->length > 0) {
         pst->sm.mean = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.ivar = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.wum = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->sm.wuw = HTS_alloc_matrix(pst->length, pst->width);
         pst->sm.g = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->par = HTS_alloc_matrix(pst->length, pst->vector_length);
      }
      /* copy dynamic window */
      pst->win_l_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_r_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_coefficient = (double **) HTS_calloc(pst->win_size, sizeof(double));
      for (j = 0; j < pst->win_size; j++) {
         pst->win_l_width[j] = HTS_SStreamSet_get_window_left_width(sss, i, j);
         pst->win_r_width[j] = HTS_SStreamSet_get_window_right_width(sss, i, j);
         if (pst->win_l_width[j] + pst->win_r_width[j] == 0)
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j] + 1, sizeof(double));
         else
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j], sizeof(double));
         pst->win_coefficient[j] -= pst->win_l_width[j];
         for (shift = pst->win_l_width[j]; shift <= pst->win_r_width[j]; shift++)
            pst->win_coefficient[j][shift] = HTS_SStreamSet_get_window_coefficient(sss, i, j, shift);
      }
      /* copy GV */
      if (HTS_SStreamSet_use_gv(sss, i)) {
         pst->gv_mean = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         pst->gv_vari = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         for (j = 0; j < pst->vector_length; j++) {
            pst->gv_mean[j] = HTS_SStreamSet_get_gv_mean(sss, i, j) * gv_weight[i];
            pst->gv_vari[j] = HTS_SStreamSet_get_gv_vari(sss, i, j);
         }
         pst->gv_switch = (HTS_Boolean *) HTS_calloc(pst->length, sizeof(HTS_Boolean));
         if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {   /* for MSD */
            for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++, frame++)
                  if (pst->msd_flag[frame] == TRUE)
                     pst->gv_switch[msd_frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         } else {               /* for non MSD */
            for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++)
                  pst->gv_switch[frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         }
         for (j = 0, pst->gv_length = 0; j < pst->length; j++)
            if (pst->gv_switch[j])
               pst->gv_length++;
      } else {
         pst->gv_switch = NULL;
         pst->gv_length = 0;
         pst->gv_mean = NULL;
         pst->gv_vari = NULL;
      }
      /* copy pdfs */
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               if (pst->msd_flag[frame] == TRUE) {
                  /* check current frame is MSD boundary or not */
                  for (k = 0; k < pst->win_size; k++) {
                     not_bound = TRUE;
                     for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                        if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift || pst->msd_flag[frame + shift] != TRUE) {
                           not_bound = FALSE;
                           break;
                        }
                     for (l = 0; l < pst->vector_length; l++) {
                        m = pst->vector_length * k + l;
                        pst->sm.mean[msd_frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                        if (not_bound || k == 0)
                           pst->sm.ivar[msd_frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                        else
                           pst->sm.ivar[msd_frame][m] = 0.0;
                     }
                  }
                  msd_frame++;
               }
               frame++;
            }
         }
      } else {                  /* for non MSD */
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               for (k = 0; k < pst->win_size; k++) {
                  not_bound = TRUE;
                  for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                     if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift) {
                        not_bound = FALSE;
                        break;
                     }
                  for (l = 0; l < pst->vector_length; l++) {
                     m = pst->vector_length * k + l;
                     pst->sm.mean[frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                     if (not_bound || k == 0)
                        pst->sm.ivar[frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                     else
                        pst->sm.ivar[frame][m] = 0.0;
                  }
               }
               frame++;
            }
         }
      }
      /* parameter generation */
      HTS_PStream_mlpg(pst);
   }

   return TRUE;
}